

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cluster.cpp
# Opt level: O1

Vector * __thiscall Clusters::operator[](Clusters *this,unsigned_long index)

{
  ostream *poVar1;
  
  if (index < this->allocated_clusters) {
    return this->list_of_clusters[index];
  }
  poVar1 = std::operator<<((ostream *)&std::cerr,"Requested an invalid cluster index ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,index);
  poVar1 = std::operator<<(poVar1," out of ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->allocated_clusters);
  poVar1 = std::operator<<(poVar1," allocated clusters ");
  std::endl<char,std::char_traits<char>>(poVar1);
  exit(1);
}

Assistant:

Vector *operator[](unsigned long index) {
    if (index < allocated_clusters) {
      return list_of_clusters[index];
    } else {
      cerr << "Requested an invalid cluster index " << index << " out of "
           << allocated_clusters << " allocated clusters " << endl;
      ;
      exit(1);
    }
  }